

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

void test_all_files(void)

{
  char *__s;
  int iVar1;
  log_level_t lVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  char compressed [80];
  char uncompressed [80];
  
  log_trace("test_all_files","\n");
  lVar5 = 0;
  while( true ) {
    if (lVar5 == 0x70) {
      return;
    }
    log_info("---------------------------------------------------------------------------------------------"
             ,"\n");
    __s = *(char **)((long)TEST_FILES + lVar5);
    pcVar3 = strrchr(__s,0x2f);
    strcpy(compressed,pcVar3 + 1);
    sVar4 = strlen(compressed);
    builtin_strncpy(compressed + sVar4,".compressed",0xc);
    strcpy(uncompressed,pcVar3 + 1);
    sVar4 = strlen(uncompressed);
    builtin_strncpy(uncompressed + sVar4,".uncompressed",0xe);
    iVar1 = adh_compress_file(__s,compressed);
    if (iVar1 == 1) break;
    lVar2 = get_log_level();
    if (LOG_INFO < lVar2) {
      puts("\n\n\n\n");
    }
    log_info("---------------","\n");
    lVar2 = get_log_level();
    if (LOG_INFO < lVar2) {
      puts("\n\n\n\n");
    }
    iVar1 = adh_decompress_file(compressed,uncompressed);
    if (iVar1 == 1) {
      return;
    }
    log_info("---------------","\n");
    iVar1 = compare_files(__s,uncompressed);
    lVar5 = lVar5 + 8;
    if (iVar1 != 0) {
      return;
    }
  }
  return;
}

Assistant:

void test_all_files() {
    log_trace("test_all_files", "\n");
    char compressed[MAX_FILE_NAME];
    char uncompressed[MAX_FILE_NAME];

    for(int i=0; i<NUM_TEST_FILES; i++) {
        log_info("---------------------------------------------------------------------------------------------", "\n");
        char * filename = strrchr(TEST_FILES[i], '/') + 1;

        strcpy(compressed, filename);
        strcat(compressed, ".compressed");

        strcpy(uncompressed, filename);
        strcat(uncompressed, ".uncompressed");

        int rc = adh_compress_file(TEST_FILES[i], compressed);
        if(rc == RC_FAIL)
            break;

        if(get_log_level() > LOG_INFO) {
            puts("\n\n\n\n");
        }


        log_info("---------------", "\n");

        if(get_log_level() > LOG_INFO)
            puts("\n\n\n\n");

        rc = adh_decompress_file(compressed, uncompressed);
        if(rc == RC_FAIL)
            break;

        log_info("---------------", "\n");
        rc = compare_files(TEST_FILES[i], uncompressed);
        if(rc == RC_FAIL)
            break;
    }
}